

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

GLuint __thiscall
QOpenGL2PaintEngineExPrivate::bindTexture<QPixmap>
          (QOpenGL2PaintEngineExPrivate *this,QPixmap *pixmap,bool *newTextureCreated)

{
  bool bVar1;
  BindResult BVar2;
  long in_RDX;
  QFlags<QOpenGLTextureCache::BindResultFlag> *in_RDI;
  long in_FS_OFFSET;
  QOpenGLContext *unaff_retaddr;
  QOpenGLTextureCache *in_stack_00000008;
  BindOptions in_stack_00000044;
  BindResult result;
  BindOption in_stack_ffffffffffffffac;
  BindResultFlag flag;
  undefined4 local_10;
  QPixmap *pixmap_00;
  
  pixmap_00 = *(QPixmap **)(in_FS_OFFSET + 0x28);
  QPointer::operator_cast_to_QOpenGLContext_((QPointer<QOpenGLContext> *)0x15ba27);
  QOpenGLTextureCache::cacheForContext((QOpenGLContext *)0x15ba2f);
  QPointer::operator_cast_to_QOpenGLContext_((QPointer<QOpenGLContext> *)0x15ba45);
  QFlags<QOpenGLTextureUploader::BindOption>::QFlags
            ((QFlags<QOpenGLTextureUploader::BindOption> *)in_RDI,in_stack_ffffffffffffffac);
  flag = (BindResultFlag)(in_stack_ffffffffffffffac >> 0x18);
  BVar2 = QOpenGLTextureCache::bindTexture
                    (in_stack_00000008,unaff_retaddr,pixmap_00,in_stack_00000044);
  if (in_RDX != 0) {
    bVar1 = QFlags<QOpenGLTextureCache::BindResultFlag>::testFlag(in_RDI,flag);
    *(bool *)in_RDX = bVar1;
  }
  local_10 = BVar2.id;
  if (*(QPixmap **)(in_FS_OFFSET + 0x28) == pixmap_00) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

GLuint QOpenGL2PaintEngineExPrivate::bindTexture(const QPixmap &pixmap, bool *newTextureCreated)
{
    QOpenGLTextureCache::BindResult result = QOpenGLTextureCache::cacheForContext(ctx)->bindTexture(ctx, pixmap);
    if (newTextureCreated)
        *newTextureCreated = result.flags.testFlag(QOpenGLTextureCache::BindResultFlag::NewTexture);
    return result.id;
}